

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,char *project,char *options)

{
  size_t __size;
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  REF_STATUS RVar6;
  FILE *pFVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  uint uVar11;
  REF_INT RVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  REF_INT item;
  REF_INT mark;
  REF_INT new_cell;
  REF_INT nnode;
  REF_INT new_node;
  REF_INT ntet;
  REF_INT ntri;
  REF_DBL xyz [3];
  REF_INT node_per;
  REF_INT attr;
  REF_INT ndim;
  REF_GLOB global;
  REF_INT id;
  REF_INT nodes [27];
  char filename [896];
  char command [1024];
  ulong local_8a0;
  uint local_894;
  int local_890;
  int local_88c;
  uint local_888;
  uint local_884;
  int local_880;
  uint local_87c;
  int local_878;
  int local_874;
  void *local_870;
  double local_868;
  double local_860;
  double local_858 [2];
  int local_844;
  int local_840;
  int local_83c;
  ulong local_838;
  undefined1 local_82c [4];
  REF_INT local_828;
  REF_INT local_824;
  REF_INT local_820;
  uint local_81c;
  char local_7b8 [896];
  char local_438 [1032];
  
  ref_node = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)ref_node->n,
         (ulong)(uint)ref_grid->cell[3]->n);
  snprintf(local_7b8,0x380,"%s-tetgen.poly",project);
  uVar3 = ref_export_by_extension(ref_grid,local_7b8);
  if (uVar3 != 0) {
    pcVar10 = "poly";
    uVar9 = 0x879;
LAB_00144693:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar9,
           "ref_geom_tetgen_volume",(ulong)uVar3,pcVar10);
    return uVar3;
  }
  puts("  The \'S1000\' argument can be added to tetgen options");
  puts("    to cap inserted nodes at 1000 and reduce run time.");
  puts("  The \'q20/10\' arguments (radius-edge-ratio/dihedral-angle)");
  puts("    can be increased for faster initial volume refinement.");
  puts("  The \'O7/7\' arguments (optimization iterations/operation)");
  puts("    can be decreased for faster mesh optimization.");
  puts("  See \'ref bootstrap -h\' for \'--mesher-options\' description");
  puts("    and the TetGen user manual for details.");
  if (options == (char *)0x0) {
    snprintf(local_438,0x400,"tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
             local_7b8,project);
  }
  else {
    snprintf(local_438,0x400,"tetgen %s %s < /dev/null > %s-tetgen.txt",options,local_7b8,project);
  }
  puts(local_438);
  fflush(_stdout);
  uVar3 = sleep(2);
  if (uVar3 == 0) {
    iVar4 = system(local_438);
    uVar3 = sleep(2);
    if (uVar3 == 0) {
      if (iVar4 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x896,"ref_geom_tetgen_volume","tetgen failed",0,(long)iVar4);
        puts("tec360 ref_geom_test_tetgen_geom.tec");
        ref_geom_tec(ref_grid,"ref_geom_test_tetgen_geom.tec");
        puts("tec360 ref_geom_test_tetgen_surf.tec");
        ref_export_tec_surf(ref_grid,"ref_geom_test_tetgen_surf.tec");
        return 1;
      }
      snprintf(local_7b8,0x380,"%s-tetgen.1.node",project);
      pFVar7 = fopen(local_7b8,"r");
      if (pFVar7 == (FILE *)0x0) {
        printf("unable to open %s\n",local_7b8);
        pcVar10 = "unable to open file";
        uVar9 = 0x89b;
        goto LAB_0014499a;
      }
      iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_880);
      if (iVar4 != 1) {
        pcVar10 = "node header nnode";
        local_8a0 = 1;
        uVar9 = 0x89d;
        uVar8 = (long)iVar4;
        goto LAB_001447f2;
      }
      iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_83c);
      if (iVar4 != 1) {
        pcVar10 = "node header ndim";
        local_8a0 = 1;
        uVar9 = 0x89e;
        uVar8 = (long)iVar4;
        goto LAB_001447f2;
      }
      if ((long)local_83c != 3) {
        pcVar10 = "not 3D";
        local_8a0 = 3;
        uVar9 = 0x89f;
        uVar8 = (long)local_83c;
        goto LAB_001447f2;
      }
      iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_840);
      if (iVar4 != 1) {
        pcVar10 = "node header attr";
        local_8a0 = 1;
        uVar9 = 0x8a0;
        uVar8 = (long)iVar4;
        goto LAB_001447f2;
      }
      uVar8 = (ulong)local_840;
      if (uVar8 == 0) {
        iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_890);
        if (iVar4 != 1) {
          pcVar10 = "node header mark";
          local_8a0 = 1;
          uVar9 = 0x8a2;
          uVar8 = (long)iVar4;
          goto LAB_001447f2;
        }
        uVar8 = (ulong)local_890;
        if (uVar8 == 0) {
          iVar4 = ref_node->n;
          local_8a0 = (ulong)iVar4;
          printf("%d interior nodes\n",(ulong)(uint)(local_880 - iVar4));
          if (0 < (long)local_8a0) {
            lVar13 = 0x10;
            uVar8 = 0;
            do {
              iVar5 = __isoc99_fscanf(pFVar7,"%d",&local_894);
              if (iVar5 != 1) {
                pcVar10 = "node item";
                local_8a0 = 1;
                uVar9 = 0x8ab;
                uVar8 = (long)iVar5;
                goto LAB_001447f2;
              }
              if (uVar8 != local_894) {
                pcVar10 = "node index";
                uVar9 = 0x8ac;
                goto LAB_00145409;
              }
              iVar5 = __isoc99_fscanf(pFVar7,"%lf",&local_868);
              if (iVar5 != 1) {
                pcVar10 = "x";
                uVar9 = 0x8ad;
                goto LAB_00145409;
              }
              iVar5 = __isoc99_fscanf(pFVar7,"%lf",&local_860);
              if (iVar5 != 1) {
                pcVar10 = "y";
                uVar9 = 0x8ae;
                goto LAB_00145409;
              }
              iVar5 = __isoc99_fscanf(pFVar7,"%lf",local_858);
              if (iVar5 != 1) {
                pcVar10 = "z";
                uVar9 = 0x8af;
                goto LAB_00145409;
              }
              pRVar1 = ref_node->real;
              dVar14 = local_868 - *(double *)((long)pRVar1 + lVar13 + -0x10);
              dVar15 = local_860 - *(double *)((long)pRVar1 + lVar13 + -8);
              dVar16 = local_858[0] - *(double *)((long)pRVar1 + lVar13);
              if (1e-12 < SQRT(dVar16 * dVar16 + dVar14 * dVar14 + dVar15 * dVar15)) {
                printf("node %d off by %e\n",uVar8 & 0xffffffff);
                pcVar10 = "tetgen moved node";
                uVar9 = 0x8b8;
                goto LAB_00145409;
              }
              uVar8 = uVar8 + 1;
              lVar13 = lVar13 + 0x78;
            } while (local_8a0 != uVar8);
          }
          if (iVar4 < local_880) {
            do {
              iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_894);
              uVar11 = local_894;
              if (iVar4 != 1) {
                pcVar10 = "node item";
                local_8a0 = 1;
                uVar9 = 0x8be;
                uVar8 = (long)iVar4;
                goto LAB_001447f2;
              }
              uVar8 = (ulong)(int)local_894;
              if ((uint)local_8a0 != local_894) {
                pcVar10 = "file node index";
                uVar9 = 0x8bf;
                goto LAB_001447f2;
              }
              uVar3 = ref_node_next_global(ref_node,(REF_GLOB *)&local_838);
              if (uVar3 != 0) {
                pcVar10 = "next global";
                uVar9 = 0x8c0;
                goto LAB_00144693;
              }
              if (local_8a0 != local_838) {
                pcVar10 = "global node index";
                uVar9 = 0x8c1;
                uVar8 = local_838;
                goto LAB_001447f2;
              }
              uVar3 = ref_node_add(ref_node,local_8a0,(REF_INT *)&local_87c);
              if (uVar3 != 0) {
                pcVar10 = "new_node";
                uVar9 = 0x8c2;
                goto LAB_00144693;
              }
              if (uVar11 != local_87c) {
                pcVar10 = "node index";
                uVar9 = 0x8c3;
                goto LAB_00145409;
              }
              iVar4 = __isoc99_fscanf(pFVar7,"%lf",&local_868);
              if (iVar4 != 1) {
                pcVar10 = "x";
                uVar9 = 0x8c4;
                goto LAB_00145409;
              }
              iVar4 = __isoc99_fscanf(pFVar7,"%lf",&local_860);
              if (iVar4 != 1) {
                pcVar10 = "y";
                uVar9 = 0x8c5;
                goto LAB_00145409;
              }
              iVar4 = __isoc99_fscanf(pFVar7,"%lf",local_858);
              if (iVar4 != 1) {
                pcVar10 = "z";
                uVar9 = 0x8c6;
                goto LAB_00145409;
              }
              pRVar1 = ref_node->real;
              lVar13 = (long)(int)local_87c;
              pRVar1[lVar13 * 0xf] = local_868;
              pRVar1[lVar13 * 0xf + 1] = local_860;
              pRVar1[lVar13 * 0xf + 2] = local_858[0];
              local_8a0 = local_8a0 + 1;
            } while ((long)local_8a0 < (long)local_880);
          }
          fclose(pFVar7);
          snprintf(local_7b8,0x380,"%s-tetgen.1.face",project);
          pFVar7 = fopen(local_7b8,"r");
          if (pFVar7 == (FILE *)0x0) {
            printf("unable to open %s\n",local_7b8);
            pcVar10 = "unable to open file";
            uVar9 = 0x8d3;
            goto LAB_0014499a;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_874);
          if (iVar4 != 1) {
            pcVar10 = "face header ntri";
            local_8a0 = 1;
            uVar9 = 0x8d4;
            uVar8 = (long)iVar4;
            goto LAB_001447f2;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_890);
          if (iVar4 != 1) {
            pcVar10 = "face header mark";
            local_8a0 = 1;
            uVar9 = 0x8d5;
            uVar8 = (long)iVar4;
            goto LAB_001447f2;
          }
          if ((long)local_890 != 1) {
            pcVar10 = "face have mark";
            local_8a0 = 1;
            uVar9 = 0x8d6;
            uVar8 = (long)local_890;
            goto LAB_001447f2;
          }
          pRVar2 = ref_grid->cell[3];
          RVar12 = pRVar2->max;
          if ((long)RVar12 < 0) {
            pcVar10 = "malloc position of REF_INT negative";
            uVar9 = 0x8d9;
LAB_00145409:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar9,"ref_geom_tetgen_volume",pcVar10);
            return 1;
          }
          __size = (long)RVar12 * 4;
          local_870 = malloc(__size);
          if (local_870 == (void *)0x0) {
            pcVar10 = "malloc position of REF_INT NULL";
            uVar9 = 0x8d9;
LAB_0014499a:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar9,"ref_geom_tetgen_volume",pcVar10);
            return 2;
          }
          if (RVar12 != 0) {
            memset(local_870,0xff,__size);
          }
          if (local_874 < 1) {
            local_88c = 0;
          }
          else {
            local_888 = 0;
            local_88c = 0;
            do {
              iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_894);
              if (iVar4 != 1) {
                pcVar10 = "tri item";
                local_8a0 = 1;
                uVar9 = 0x8db;
                uVar8 = (long)iVar4;
                goto LAB_001447f2;
              }
              if (local_888 != local_894) {
                pcVar10 = "tri index";
                uVar9 = 0x8dc;
                goto LAB_00145409;
              }
              lVar13 = 0;
              do {
                iVar4 = __isoc99_fscanf(pFVar7,"%d",(long)&local_828 + lVar13);
                if (iVar4 != 1) {
                  pcVar10 = "tri";
                  uVar9 = 0x8de;
                  goto LAB_00145409;
                }
                lVar13 = lVar13 + 4;
              } while (lVar13 != 0xc);
              if ((local_890 == 1) && (iVar4 = __isoc99_fscanf(pFVar7,"%d",local_82c), iVar4 != 1))
              {
                pcVar10 = "tri mark id";
                local_8a0 = 1;
                uVar9 = 0x8df;
                uVar8 = (long)iVar4;
                goto LAB_001447f2;
              }
              RVar6 = ref_cell_with(pRVar2,&local_828,(REF_INT *)&local_884);
              if (RVar6 == 0) {
                *(uint *)((long)local_870 + (long)(int)local_884 * 4) = local_888;
              }
              else {
                ref_node_location(ref_node,local_828);
                ref_node_location(ref_node,local_824);
                ref_node_location(ref_node,local_820);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x8e7,"ref_geom_tetgen_volume","tetgen face tri not found in ref_grid");
                local_88c = 1;
              }
              local_888 = local_888 + 1;
            } while ((int)local_888 < local_874);
            RVar12 = pRVar2->max;
          }
          if (0 < RVar12) {
            lVar13 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar2,(REF_INT)lVar13,&local_828);
              if ((RVar6 == 0) && (*(int *)((long)local_870 + lVar13 * 4) == -1)) {
                ref_node_location(ref_node,local_828);
                ref_node_location(ref_node,local_824);
                ref_node_location(ref_node,local_820);
                printf("face id %d\n",(ulong)local_81c);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x8f1,"ref_geom_tetgen_volume","ref_grid tri not found in tetgen face");
                local_88c = 1;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pRVar2->max);
          }
          free(local_870);
          if (local_88c != 0) {
            pcVar10 = "problem detected in tetgen triangles";
            uVar9 = 0x8f5;
            goto LAB_00145409;
          }
          fclose(pFVar7);
          snprintf(local_7b8,0x380,"%s-tetgen.1.ele",project);
          pFVar7 = fopen(local_7b8,"r");
          if (pFVar7 == (FILE *)0x0) {
            printf("unable to open %s\n",local_7b8);
            pcVar10 = "unable to open file";
            uVar9 = 0x8fc;
            goto LAB_0014499a;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_878);
          if (iVar4 != 1) {
            pcVar10 = "ele header ntet";
            local_8a0 = 1;
            uVar9 = 0x8fe;
            uVar8 = (long)iVar4;
            goto LAB_001447f2;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_844);
          if (iVar4 != 1) {
            pcVar10 = "ele header node_per";
            local_8a0 = 1;
            uVar9 = 0x8ff;
            uVar8 = (long)iVar4;
            goto LAB_001447f2;
          }
          if ((long)local_844 != 4) {
            pcVar10 = "expected tets";
            local_8a0 = 4;
            uVar9 = 0x900;
            uVar8 = (long)local_844;
            goto LAB_001447f2;
          }
          iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_890);
          if (iVar4 != 1) {
            pcVar10 = "ele header mark";
            local_8a0 = 1;
            uVar9 = 0x901;
            uVar8 = (long)iVar4;
            goto LAB_001447f2;
          }
          uVar8 = (ulong)local_890;
          if (uVar8 == 0) {
            if (0 < local_878) {
              pRVar2 = ref_grid->cell[8];
              uVar11 = 0;
              do {
                iVar4 = __isoc99_fscanf(pFVar7,"%d",&local_894);
                if (iVar4 != 1) {
                  pcVar10 = "tet item";
                  local_8a0 = 1;
                  uVar9 = 0x906;
                  uVar8 = (long)iVar4;
                  goto LAB_001447f2;
                }
                if (uVar11 != local_894) {
                  pcVar10 = "tet index";
                  uVar9 = 0x907;
                  goto LAB_00145409;
                }
                lVar13 = 0;
                do {
                  iVar4 = __isoc99_fscanf(pFVar7,"%d",(long)&local_828 + lVar13);
                  if (iVar4 != 1) {
                    pcVar10 = "tet";
                    uVar9 = 0x909;
                    goto LAB_00145409;
                  }
                  lVar13 = lVar13 + 4;
                } while (lVar13 != 0x10);
                uVar3 = ref_cell_add(pRVar2,&local_828,(REF_INT *)&local_884);
                if (uVar3 != 0) {
                  pcVar10 = "new tet";
                  uVar9 = 0x90a;
                  goto LAB_00144693;
                }
                if (uVar11 != local_884) {
                  pcVar10 = "tet index";
                  uVar9 = 0x90b;
                  goto LAB_00145409;
                }
                uVar11 = uVar11 + 1;
              } while ((int)uVar11 < local_878);
            }
            fclose(pFVar7);
            ref_grid->surf = 0;
            snprintf(local_7b8,0x380,"%s-tetgen.1.edge",project);
            iVar4 = remove(local_7b8);
            if (iVar4 == 0) {
              snprintf(local_7b8,0x380,"%s-tetgen.1.face",project);
              iVar4 = remove(local_7b8);
              if (iVar4 == 0) {
                snprintf(local_7b8,0x380,"%s-tetgen.1.node",project);
                iVar4 = remove(local_7b8);
                if (iVar4 == 0) {
                  snprintf(local_7b8,0x380,"%s-tetgen.1.ele",project);
                  iVar4 = remove(local_7b8);
                  if (iVar4 == 0) {
                    snprintf(local_7b8,0x380,"%s-tetgen.poly",project);
                    iVar4 = remove(local_7b8);
                    if (iVar4 == 0) {
                      return 0;
                    }
                    uVar8 = (ulong)iVar4;
                    pcVar10 = "rm .poly tetgen input file";
                    uVar9 = 0x91c;
                  }
                  else {
                    uVar8 = (ulong)iVar4;
                    pcVar10 = "rm .1.ele tetgen output file";
                    uVar9 = 0x91a;
                  }
                }
                else {
                  uVar8 = (ulong)iVar4;
                  pcVar10 = "rm .1.node tetgen output file";
                  uVar9 = 0x918;
                }
              }
              else {
                uVar8 = (ulong)iVar4;
                pcVar10 = "rm .1.face tetgen output file";
                uVar9 = 0x916;
              }
            }
            else {
              uVar8 = (ulong)iVar4;
              pcVar10 = "rm .1.edge tetgen output file";
              uVar9 = 0x914;
            }
          }
          else {
            pcVar10 = "ele have mark";
            uVar9 = 0x902;
          }
        }
        else {
          pcVar10 = "nodes have mark";
          uVar9 = 0x8a3;
        }
      }
      else {
        pcVar10 = "nodes have attribute 3D";
        uVar9 = 0x8a1;
      }
    }
    else {
      uVar8 = (ulong)uVar3;
      pcVar10 = "sleep failed";
      uVar9 = 0x890;
    }
  }
  else {
    uVar8 = (ulong)uVar3;
    pcVar10 = "sleep failed";
    uVar9 = 0x88e;
  }
  local_8a0 = 0;
LAB_001447f2:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar9,
         "ref_geom_tetgen_volume",pcVar10,local_8a0,uVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,
                                          const char *project,
                                          const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  char filename[896];
  char command[1024];
  FILE *file;
  REF_INT nnode, ndim, attr, mark;
  REF_GLOB global;
  REF_INT ntri, ntet, node_per, id;
  REF_INT node, nnode_surface, item, new_node;
  REF_DBL xyz[3], dist;
  REF_INT cell, new_cell, nodes[REF_CELL_MAX_SIZE_PER];
  int system_status;
  REF_BOOL delete_temp_files = REF_TRUE;
  REF_BOOL problem;
  REF_BOOL *position;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 896, "%s-tetgen.poly", project);
  RSS(ref_export_by_extension(ref_grid, filename), "poly");

  printf("  The 'S1000' argument can be added to tetgen options\n");
  printf("    to cap inserted nodes at 1000 and reduce run time.\n");
  printf("  The 'q20/10' arguments (radius-edge-ratio/dihedral-angle)\n");
  printf("    can be increased for faster initial volume refinement.\n");
  printf("  The 'O7/7' arguments (optimization iterations/operation)\n");
  printf("    can be decreased for faster mesh optimization.\n");
  printf("  See 'ref bootstrap -h' for '--mesher-options' description\n");
  printf("    and the TetGen user manual for details.\n");

  if (NULL == options) {
    snprintf(command, 1024,
             "tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
             filename, project);
  } else {
    snprintf(command, 1024, "tetgen %s %s < /dev/null > %s-tetgen.txt", options,
             filename, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  REIS(0, sleep(2), "sleep failed");
  system_status = system(command);
  REIS(0, sleep(2), "sleep failed");
  REIB(0, system_status, "tetgen failed", {
    printf("tec360 ref_geom_test_tetgen_geom.tec\n");
    ref_geom_tec(ref_grid, "ref_geom_test_tetgen_geom.tec");
    printf("tec360 ref_geom_test_tetgen_surf.tec\n");
    ref_export_tec_surf(ref_grid, "ref_geom_test_tetgen_surf.tec");
  });

  snprintf(filename, 896, "%s-tetgen.1.node", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  /* verify surface nodes */
  nnode_surface = ref_node_n(ref_node);

  printf("%d interior nodes\n", nnode - nnode_surface);

  for (node = 0; node < nnode_surface; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    RES(node, item, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    dist = sqrt((xyz[0] - ref_node_xyz(ref_node, 0, node)) *
                    (xyz[0] - ref_node_xyz(ref_node, 0, node)) +
                (xyz[1] - ref_node_xyz(ref_node, 1, node)) *
                    (xyz[1] - ref_node_xyz(ref_node, 1, node)) +
                (xyz[2] - ref_node_xyz(ref_node, 2, node)) *
                    (xyz[2] - ref_node_xyz(ref_node, 2, node)));
    if (dist > 1.0e-12) {
      printf("node %d off by %e\n", node, dist);
      THROW("tetgen moved node");
    }
  }

  /* interior nodes */
  for (node = nnode_surface; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_next_global(ref_node, &global), "next global");
    REIS(node, global, "global node index");
    RSS(ref_node_add(ref_node, global, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  fclose(file);

  /* check .1.face when paranoid, but tetgen -z should not mess with them */
  problem = REF_FALSE;
  snprintf(filename, 896, "%s-tetgen.1.face", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");
  REIS(1, mark, "face have mark");

  ref_cell = ref_grid_tri(ref_grid);
  ref_malloc_init(position, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tri item");
    RES(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    if (REF_SUCCESS == ref_cell_with(ref_cell, nodes, &new_cell)) {
      position[new_cell] = cell;
    } else {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      REF_WHERE("tetgen face tri not found in ref_grid");
    }
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY == position[cell]) {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      printf("face id %d\n", nodes[3]);
      REF_WHERE("ref_grid tri not found in tetgen face");
    }
  }
  ref_free(position);
  RAS(!problem, "problem detected in tetgen triangles");

  fclose(file);

  snprintf(filename, 896, "%s-tetgen.1.ele", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &ntet), "ele header ntet");
  REIS(1, fscanf(file, "%d", &node_per), "ele header node_per");
  REIS(4, node_per, "expected tets");
  REIS(1, fscanf(file, "%d", &mark), "ele header mark");
  REIS(0, mark, "ele have mark");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tet item");
    RES(cell, item, "tet index");
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  ref_grid_surf(ref_grid) = REF_FALSE;

  if (delete_temp_files) {
    snprintf(filename, 896, "%s-tetgen.1.edge", project);
    REIS(0, remove(filename), "rm .1.edge tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.face", project);
    REIS(0, remove(filename), "rm .1.face tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.node", project);
    REIS(0, remove(filename), "rm .1.node tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.ele", project);
    REIS(0, remove(filename), "rm .1.ele tetgen output file");
    snprintf(filename, 896, "%s-tetgen.poly", project);
    REIS(0, remove(filename), "rm .poly tetgen input file");
  }

  return REF_SUCCESS;
}